

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_nyi(jit_State *J,RecordFFData *rd)

{
  size_t __n;
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  lua_State *plVar4;
  TValue *pTVar5;
  uint *u64;
  TRef *pTVar6;
  TRef TVar7;
  ulong uVar8;
  
  if ((J->cur).nins < J->param[5] + 0x8000U) {
    lj_trace_err_info(J,LJ_TRERR_TRACEUV);
  }
  if (J->framedepth != 0) {
    plVar4 = J->L;
    pTVar5 = plVar4->base;
    u64 = (uint *)pTVar5[-1].u64;
    if ((((((ulong)u64 & 3) == 0) && (uVar3 = *u64, (uVar3 & 0xfd) != 0x41)) && ((char)uVar3 != '?')
        ) && ((uVar3 & 0xff) != 0x49)) {
      uVar1 = (J->fn->c).ffid;
      if (((uVar1 != '\x13') && (uVar1 != 0x9e)) && (uVar1 != 0xa4)) {
        if ((uint)J->param[4] <= (uint)(J->cur).nsnap) {
          lj_trace_err(J,LJ_TRERR_SNAPOV);
        }
        bVar2 = *(byte *)((long)u64 + -3);
        uVar8 = (ulong)(J->maxslot + 2);
        __n = uVar8 * 8;
        memmove(pTVar5 + 1,pTVar5 + -2,__n);
        pTVar5[2].u64 = (ulong)bVar2 * 8 + 0x2a;
        pTVar5[-1].n = (lua_Number)lj_cont_stitch;
        pTVar5->u64 = (uint64_t)u64;
        pTVar5[-2].u64 = 0xffffffffffffffff;
        plVar4->base = plVar4->base + 3;
        plVar4->top = plVar4->top + 3;
        memmove(J->base + 1,J->base + -2,uVar8 << 2);
        J->base[2] = 0x10000;
        TVar7 = lj_ir_k64(J,IR_KNUM,0x12f35a);
        J->base[-1] = TVar7;
        TVar7 = lj_ir_k64(J,IR_KNUM,(uint64_t)u64);
        *J->base = TVar7 | 0x20000;
        TVar7 = lj_ir_ktrace(J);
        pTVar6 = J->base;
        pTVar6[-2] = TVar7;
        J->ktrace = (IRRef1)TVar7;
        J->base = pTVar6 + 3;
        J->baseslot = J->baseslot + 3;
        J->framedepth = J->framedepth + 1;
        lj_record_stop(J,LJ_TRLINK_STITCH,0);
        memmove(pTVar5 + -2,pTVar5 + 1,__n);
        pTVar5[-1].u64 = (uint64_t)u64;
        plVar4->base = plVar4->base + -3;
        plVar4->top = plVar4->top + -3;
        goto LAB_001554be;
      }
    }
  }
  lj_record_stop(J,LJ_TRLINK_RETURN,0);
LAB_001554be:
  rd->nres = -1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_nyi(jit_State *J, RecordFFData *rd)
{
  if (J->cur.nins < (IRRef)J->param[JIT_P_minstitch] + REF_BASE) {
    lj_trace_err_info(J, LJ_TRERR_TRACEUV);
  } else {
    /* Can only stitch from Lua call. */
    if (J->framedepth && frame_islua(J->L->base-1)) {
      BCOp op = bc_op(*frame_pc(J->L->base-1));
      /* Stitched trace cannot start with *M op with variable # of args. */
      if (!(op == BC_CALLM || op == BC_CALLMT ||
	    op == BC_RETM || op == BC_TSETM)) {
	switch (J->fn->c.ffid) {
	case FF_error:
	case FF_debug_sethook:
	case FF_jit_flush:
	  break;  /* Don't stitch across special builtins. */
	default:
	  recff_stitch(J);  /* Use trace stitching. */
	  rd->nres = -1;
	  return;
	}
      }
    }
    /* Otherwise stop trace and return to interpreter. */
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);
    rd->nres = -1;
  }
}